

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VmaSuballocation *
VmaBinaryFindSorted<VmaSuballocationOffsetGreater,VmaSuballocation*,VmaSuballocation>
          (VmaSuballocation **beg,VmaSuballocation **end,VmaSuballocation *value,
          VmaSuballocationOffsetGreater *cmp)

{
  bool bVar1;
  VmaSuballocationOffsetGreater *in_RCX;
  VmaSuballocation *in_RDX;
  VmaSuballocation *in_RSI;
  VmaSuballocation *in_RDI;
  VmaSuballocation *it;
  VmaSuballocation *local_8;
  
  local_8 = VmaBinaryFindFirstNotLess<VmaSuballocationOffsetGreater,VmaSuballocation*,VmaSuballocation>
                      (in_RDI,in_RSI,in_RDX,in_RCX);
  if ((local_8 != (VmaSuballocation *)in_RSI->offset) &&
     ((bVar1 = VmaSuballocationOffsetGreater::operator()(in_RCX,local_8,in_RDX), bVar1 ||
      (bVar1 = VmaSuballocationOffsetGreater::operator()(in_RCX,in_RDX,local_8), bVar1)))) {
    local_8 = (VmaSuballocation *)in_RSI->offset;
  }
  return local_8;
}

Assistant:

IterT VmaBinaryFindSorted(const IterT& beg, const IterT& end, const KeyT& value, const CmpLess& cmp)
{
    IterT it = VmaBinaryFindFirstNotLess<CmpLess, IterT, KeyT>(
        beg, end, value, cmp);
    if (it == end ||
        (!cmp(*it, value) && !cmp(value, *it)))
    {
        return it;
    }
    return end;
}